

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

string * __thiscall
lzstring::LZString::CompressToEncodedURIComponent
          (string *__return_storage_ptr__,LZString *this,wstring *input)

{
  undefined8 input_00;
  ulong uVar1;
  anon_class_1_0_00000001 local_61;
  GetCharFromIntFunc local_60;
  undefined1 local_40 [8];
  wstring tmp;
  wstring *input_local;
  LZString *this_local;
  string *res;
  
  tmp.field_2._8_8_ = input;
  uVar1 = std::__cxx11::wstring::empty();
  input_00 = tmp.field_2._8_8_;
  if ((uVar1 & 1) == 0) {
    std::function<wchar_t(int)>::
    function<lzstring::LZString::CompressToEncodedURIComponent(std::__cxx11::wstring_const&)::__0,void>
              ((function<wchar_t(int)> *)&local_60,&local_61);
    Compress((wstring *)local_40,this,(wstring *)input_00,6,&local_60);
    std::function<wchar_t_(int)>::~function(&local_60);
    to_string(__return_storage_ptr__,(wstring *)local_40);
    std::__cxx11::wstring::~wstring((wstring *)local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LZString::CompressToEncodedURIComponent(const std::wstring &input)
{
	if (input.empty())
		return std::string();

	std::wstring tmp = Compress(input, 6, [](int code) { return (wchar_t)kKeyStrUriSafe[code]; });
	std::string res = to_string(tmp);
	return res;
}